

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O0

void __thiscall Polynom<Finite>::extend(Polynom<Finite> *this,uint sz)

{
  uint uVar1;
  uint in_ESI;
  Matrix<Finite> *in_RDI;
  Matrix<Finite> *unaff_retaddr;
  Matrix<Finite> *in_stack_00000008;
  Matrix<Finite> *in_stack_00000040;
  undefined4 in_stack_00000048;
  undefined4 in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  Matrix<Finite> *in_stack_ffffffffffffffe0;
  
  uVar1 = Matrix<Finite>::width(in_RDI);
  if (uVar1 < in_ESI) {
    Matrix<Finite>::width(in_RDI);
    Matrix<Finite>::Matrix
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    Matrix<Finite>::joinHorizontal
              ((Matrix<Finite> *)CONCAT44(sz,in_stack_00000048),in_stack_00000040);
    Matrix<Finite>::operator=(in_stack_00000008,unaff_retaddr);
    Matrix<Finite>::~Matrix((Matrix<Finite> *)CONCAT44(in_stack_ffffffffffffffc4,in_ESI));
    Matrix<Finite>::~Matrix((Matrix<Finite> *)CONCAT44(in_stack_ffffffffffffffc4,in_ESI));
  }
  return;
}

Assistant:

void Polynom<Field>::extend(unsigned sz)
{
    if(sz > m.width())
        m = Matrix<Field>(1, sz - m.width()).joinHorizontal(m);
}